

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void setup_processing_stripe_boundary
               (RestorationTileLimits *limits,RestorationStripeBoundaries *rsb,int rsb_row,
               int use_highbd,int h,uint8_t *data8,int data_stride,RestorationLineBuffers *rlbs,
               int copy_above,int copy_below,int opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  byte bVar8;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  void *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  uint8_t *dst8_3;
  uint8_t *data8_bl_1;
  int stripe_end_1;
  uint8_t *dst8_2;
  uint8_t *data8_tl_1;
  uint8_t *dst8_1;
  uint8_t *src;
  int buf_off_1;
  int buf_row_1;
  int i_1;
  uint8_t *data8_bl;
  int stripe_end;
  uint8_t *dst8;
  uint8_t *buf;
  int buf_off;
  int buf_row;
  int i;
  uint8_t *data8_tl;
  int data_x0;
  int line_size;
  int line_width;
  int buf_x0_off;
  int buf_stride;
  void *local_150;
  void *local_138;
  void *local_128;
  void *local_110;
  void *local_100;
  void *local_f8;
  int local_e8;
  void *local_e0;
  void *local_d8;
  int local_c8;
  int local_7c;
  int local_4c;
  
  lVar6 = in_RSI[2];
  iVar1 = *in_RDI;
  bVar8 = (byte)in_ECX;
  iVar4 = (in_RDI[1] - *in_RDI) + 8 << (bVar8 & 0x1f);
  iVar5 = *in_RDI + -4;
  if (in_stack_00000028 == 0) {
    if (in_stack_00000018 != 0) {
      iVar2 = in_RDI[2];
      for (local_4c = -3; local_4c < 0; local_4c = local_4c + 1) {
        if (local_4c + 2 < 1) {
          local_c8 = 0;
        }
        else {
          local_c8 = local_4c + 2;
        }
        lVar3 = *in_RSI;
        local_e0 = (void *)(in_R9 + iVar5 + (long)(iVar2 * in_stack_00000008) +
                           (long)(local_4c * in_stack_00000008));
        local_d8 = local_e0;
        if (in_ECX != 0) {
          local_d8 = (void *)((long)local_e0 * 2);
        }
        memcpy((void *)((long)in_stack_00000010 + (long)(local_4c + 3) * 0x310),local_d8,(long)iVar4
              );
        if (in_ECX != 0) {
          local_e0 = (void *)((long)local_e0 * 2);
        }
        memcpy(local_e0,(void *)(lVar3 + (iVar1 + (in_EDX + local_c8) * (int)lVar6 << (bVar8 & 0x1f)
                                         )),(long)iVar4);
      }
    }
    if (in_stack_00000020 != 0) {
      iVar2 = in_RDI[2];
      for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
        if (local_7c < 1) {
          local_e8 = local_7c;
        }
        else {
          local_e8 = 1;
        }
        lVar3 = in_RSI[1];
        local_100 = (void *)(in_R9 + iVar5 + (long)((iVar2 + in_R8D) * in_stack_00000008) +
                            (long)(local_7c * in_stack_00000008));
        local_f8 = local_100;
        if (in_ECX != 0) {
          local_f8 = (void *)((long)local_100 * 2);
        }
        memcpy((void *)((long)in_stack_00000010 + (long)local_7c * 0x310 + 0x930),local_f8,
               (long)iVar4);
        if (in_ECX != 0) {
          local_100 = (void *)((long)local_100 * 2);
        }
        memcpy(local_100,
               (void *)(lVar3 + (iVar1 + (in_EDX + local_e8) * (int)lVar6 << (bVar8 & 0x1f))),
               (long)iVar4);
      }
    }
  }
  else {
    if (in_stack_00000018 != 0) {
      lVar6 = in_R9 + iVar5 + (long)(in_RDI[2] * in_stack_00000008);
      pvVar7 = (void *)(lVar6 + in_stack_00000008 * -3);
      local_110 = pvVar7;
      if (in_ECX != 0) {
        local_110 = (void *)((long)pvVar7 * 2);
      }
      memcpy(in_stack_00000010,local_110,(long)iVar4);
      if (in_ECX == 0) {
        local_128 = (void *)(lVar6 + in_stack_00000008 * -2);
      }
      else {
        pvVar7 = (void *)((long)pvVar7 * 2);
        local_128 = (void *)((lVar6 + in_stack_00000008 * -2) * 2);
      }
      memcpy(pvVar7,local_128,(long)iVar4);
    }
    if (in_stack_00000020 != 0) {
      lVar6 = in_R9 + iVar5 + (long)((in_RDI[2] + in_R8D) * in_stack_00000008);
      pvVar7 = (void *)(lVar6 + (in_stack_00000008 << 1));
      local_138 = pvVar7;
      if (in_ECX != 0) {
        local_138 = (void *)((long)pvVar7 * 2);
      }
      memcpy((void *)((long)in_stack_00000010 + 0xf50),local_138,(long)iVar4);
      if (in_ECX == 0) {
        local_150 = (void *)(lVar6 + in_stack_00000008);
      }
      else {
        pvVar7 = (void *)((long)pvVar7 * 2);
        local_150 = (void *)((lVar6 + in_stack_00000008) * 2);
      }
      memcpy(pvVar7,local_150,(long)iVar4);
    }
  }
  return;
}

Assistant:

static void setup_processing_stripe_boundary(
    const RestorationTileLimits *limits, const RestorationStripeBoundaries *rsb,
    int rsb_row, int use_highbd, int h, uint8_t *data8, int data_stride,
    RestorationLineBuffers *rlbs, int copy_above, int copy_below, int opt) {
  // Offsets within the line buffers. The buffer logically starts at column
  // -RESTORATION_EXTRA_HORZ so the 1st column (at x0 - RESTORATION_EXTRA_HORZ)
  // has column x0 in the buffer.
  const int buf_stride = rsb->stripe_boundary_stride;
  const int buf_x0_off = limits->h_start;
  const int line_width =
      (limits->h_end - limits->h_start) + 2 * RESTORATION_EXTRA_HORZ;
  const int line_size = line_width << use_highbd;

  const int data_x0 = limits->h_start - RESTORATION_EXTRA_HORZ;

  // Replace RESTORATION_BORDER pixels above the top of the stripe
  // We expand RESTORATION_CTX_VERT=2 lines from rsb->stripe_boundary_above
  // to fill RESTORATION_BORDER=3 lines of above pixels. This is done by
  // duplicating the topmost of the 2 lines (see the AOMMAX call when
  // calculating src_row, which gets the values 0, 0, 1 for i = -3, -2, -1).
  if (!opt) {
    if (copy_above) {
      uint8_t *data8_tl = data8 + data_x0 + limits->v_start * data_stride;

      for (int i = -RESTORATION_BORDER; i < 0; ++i) {
        const int buf_row = rsb_row + AOMMAX(i + RESTORATION_CTX_VERT, 0);
        const int buf_off = buf_x0_off + buf_row * buf_stride;
        const uint8_t *buf =
            rsb->stripe_boundary_above + (buf_off << use_highbd);
        uint8_t *dst8 = data8_tl + i * data_stride;
        // Save old pixels, then replace with data from stripe_boundary_above
        memcpy(rlbs->tmp_save_above[i + RESTORATION_BORDER],
               REAL_PTR(use_highbd, dst8), line_size);
        memcpy(REAL_PTR(use_highbd, dst8), buf, line_size);
      }
    }

    // Replace RESTORATION_BORDER pixels below the bottom of the stripe.
    // The second buffer row is repeated, so src_row gets the values 0, 1, 1
    // for i = 0, 1, 2.
    if (copy_below) {
      const int stripe_end = limits->v_start + h;
      uint8_t *data8_bl = data8 + data_x0 + stripe_end * data_stride;

      for (int i = 0; i < RESTORATION_BORDER; ++i) {
        const int buf_row = rsb_row + AOMMIN(i, RESTORATION_CTX_VERT - 1);
        const int buf_off = buf_x0_off + buf_row * buf_stride;
        const uint8_t *src =
            rsb->stripe_boundary_below + (buf_off << use_highbd);

        uint8_t *dst8 = data8_bl + i * data_stride;
        // Save old pixels, then replace with data from stripe_boundary_below
        memcpy(rlbs->tmp_save_below[i], REAL_PTR(use_highbd, dst8), line_size);
        memcpy(REAL_PTR(use_highbd, dst8), src, line_size);
      }
    }
  } else {
    if (copy_above) {
      uint8_t *data8_tl = data8 + data_x0 + limits->v_start * data_stride;

      // Only save and overwrite i=-RESTORATION_BORDER line.
      uint8_t *dst8 = data8_tl + (-RESTORATION_BORDER) * data_stride;
      // Save old pixels, then replace with data from stripe_boundary_above
      memcpy(rlbs->tmp_save_above[0], REAL_PTR(use_highbd, dst8), line_size);
      memcpy(REAL_PTR(use_highbd, dst8),
             REAL_PTR(use_highbd,
                      data8_tl + (-RESTORATION_BORDER + 1) * data_stride),
             line_size);
    }

    if (copy_below) {
      const int stripe_end = limits->v_start + h;
      uint8_t *data8_bl = data8 + data_x0 + stripe_end * data_stride;

      // Only save and overwrite i=2 line.
      uint8_t *dst8 = data8_bl + 2 * data_stride;
      // Save old pixels, then replace with data from stripe_boundary_below
      memcpy(rlbs->tmp_save_below[2], REAL_PTR(use_highbd, dst8), line_size);
      memcpy(REAL_PTR(use_highbd, dst8),
             REAL_PTR(use_highbd, data8_bl + (2 - 1) * data_stride), line_size);
    }
  }
}